

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_expression.cpp
# Opt level: O0

void __thiscall duckdb::BaseExpression::Print(BaseExpression *this)

{
  long *in_RDI;
  string asStack_28 [40];
  
  (**(code **)(*in_RDI + 0x40))();
  Printer::Print((string *)0x2a1907b);
  ::std::__cxx11::string::~string(asStack_28);
  return;
}

Assistant:

void BaseExpression::Print() const {
	Printer::Print(ToString());
}